

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  short sVar7;
  short sVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  bool bVar13;
  short sVar14;
  undefined1 auVar15 [16];
  unkbyte10 Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  parasail_result_t *ppVar22;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  uint uVar23;
  long lVar24;
  int16_t *piVar25;
  ulong uVar26;
  char *pcVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  char *__format;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int16_t iVar43;
  undefined8 unaff_R12;
  ulong uVar44;
  long lVar45;
  undefined4 uVar46;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar47;
  undefined1 auVar50 [16];
  short sVar51;
  undefined1 auVar52 [16];
  short sVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar66;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  long local_2b0;
  short local_2a8;
  short sStack_2a6;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  long local_1a0;
  long local_198;
  ulong local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  int *local_138;
  int *local_130;
  int *local_128;
  int *local_120;
  int *local_118;
  ulong local_110;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar76;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar27 = "_s2";
  }
  else {
    uVar44 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar27 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar27 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar27 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar27 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        uVar31 = (ulong)(uint)matrix->length;
LAB_0055a8eb:
        uVar23 = (uint)uVar31;
        uVar33 = s2Len + 7;
        iVar34 = -open;
        iVar30 = matrix->min;
        iVar42 = -iVar30;
        if (iVar30 != iVar34 && SBORROW4(iVar30,iVar34) == iVar30 + open < 0) {
          iVar42 = open;
        }
        uVar28 = iVar42 - 0x7fff;
        iVar30 = matrix->max;
        auVar48 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
        uVar46 = auVar48._0_4_;
        local_2a8 = auVar48._0_2_;
        sStack_2a6 = auVar48._2_2_;
        local_f8 = 0;
        local_258 = (undefined1  [16])0x0;
        if (s1_beg == 0) {
          auVar48 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
          local_f8 = auVar48._0_4_;
        }
        local_1b8._0_8_ = CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46));
        local_1b8._8_8_ = CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46));
        local_1c8._8_8_ = local_1b8._8_8_;
        local_1c8._0_8_ = local_1b8._0_8_;
        local_e8._8_8_ = local_1b8._8_8_;
        local_e8._0_8_ = local_1b8._0_8_;
        local_1d8._8_8_ = local_1b8._8_8_;
        local_1d8._0_8_ = local_1b8._0_8_;
        if (s1_beg == 0) {
          local_258._6_2_ = (short)(iVar34 + gap * -4);
          local_258._4_2_ = (short)(gap * 0xfffb - open);
          local_258._2_2_ = (short)(gap * 0xfffa - open);
          local_258._0_2_ = (short)(gap * 0xfff9 - open);
          local_258._10_2_ = (short)(iVar34 + gap * -2);
          local_258._8_2_ = (short)(gap * 0xfffd - open);
          local_258._14_2_ = (short)iVar34;
          local_258._12_2_ = (short)(iVar34 - gap);
        }
        uStack_f4 = local_f8;
        uStack_f0 = local_f8;
        uStack_ec = local_f8;
        ppVar22 = parasail_result_new_table1(uVar23,s2Len);
        if (ppVar22 != (parasail_result_t *)0x0) {
          ppVar22->flag =
               (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
               (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x8221002;
          uVar38 = (ulong)(s2Len + 0xe);
          ptr = parasail_memalign_int16_t(0x10,uVar38);
          ptr_00 = parasail_memalign_int16_t(0x10,uVar38);
          ptr_01 = parasail_memalign_int16_t(0x10,uVar38);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar45 = (long)(int)uVar23;
            if (matrix->type == 0) {
              ptr_02 = parasail_memalign_int16_t(0x10,(long)(int)(uVar23 + 7));
              uVar38 = 0;
              if (ptr_02 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar26 = 0;
              if (0 < (int)uVar23) {
                uVar26 = uVar31;
              }
              for (; lVar24 = lVar45, uVar26 != uVar38; uVar38 = uVar38 + 1) {
                ptr_02[uVar38] = (int16_t)matrix->mapper[(byte)_s1[uVar38]];
              }
              for (; lVar24 < (int)(uVar23 + 7); lVar24 = lVar24 + 1) {
                ptr_02[lVar24] = 0;
              }
            }
            else {
              ptr_02 = (int16_t *)0x0;
            }
            auVar48 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R12 >> 0x10),0x7ffe - (short)iVar30
                                            ));
            auVar49 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
            auVar52 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
            auVar54 = pshuflw(auVar48,auVar48,0);
            auVar48 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            auVar58 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar47 = auVar49._0_4_;
            local_78._4_4_ = uVar47;
            local_78._0_4_ = uVar47;
            local_78._8_4_ = uVar47;
            local_78._12_4_ = uVar47;
            auVar61._8_4_ = 0xffffffff;
            auVar61._0_8_ = 0xffffffffffffffff;
            auVar61._12_4_ = 0xffffffff;
            local_98._0_4_ = auVar52._0_4_;
            local_98._4_4_ = local_98._0_4_;
            local_98._8_4_ = local_98._0_4_;
            local_98._12_4_ = local_98._0_4_;
            local_108 = auVar54._0_2_;
            sStack_106 = auVar54._2_2_;
            local_a8 = auVar48._0_4_;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            local_b8 = auVar58._0_4_;
            uStack_b4 = local_b8;
            uStack_b0 = local_b8;
            uStack_ac = local_b8;
            auVar20 = local_78;
            local_c8 = paddsw(local_78,auVar61);
            auVar48 = local_c8;
            auVar58 = local_98;
            local_88 = paddsw(auVar61,local_98);
            auVar61 = local_88;
            piVar1 = matrix->mapper;
            for (uVar31 = 0; uVar44 != uVar31; uVar31 = uVar31 + 1) {
              ptr[uVar31 + 7] = (int16_t)piVar1[(byte)_s2[uVar31]];
            }
            for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
              ptr[lVar24] = 0;
            }
            piVar25 = ptr + uVar44 + 7;
            for (uVar31 = uVar44; (int)uVar31 < (int)uVar33; uVar31 = (ulong)((int)uVar31 + 1)) {
              *piVar25 = 0;
              piVar25 = piVar25 + 1;
            }
            uVar31 = 0;
            iVar43 = (int16_t)uVar28;
            iVar30 = iVar34;
            if (s2_beg == 0) {
              for (; uVar44 != uVar31; uVar31 = uVar31 + 1) {
                ptr_00[uVar31 + 7] = (int16_t)iVar30;
                ptr_01[uVar31 + 7] = iVar43;
                iVar30 = iVar30 - gap;
              }
            }
            else {
              for (; uVar44 != uVar31; uVar31 = uVar31 + 1) {
                ptr_00[uVar31 + 7] = 0;
                ptr_01[uVar31 + 7] = iVar43;
              }
            }
            for (lVar24 = 0; uVar31 = uVar44, lVar24 != 7; lVar24 = lVar24 + 1) {
              ptr_00[lVar24] = iVar43;
              ptr_01[lVar24] = iVar43;
            }
            for (; (int)uVar31 < (int)uVar33; uVar31 = uVar31 + 1) {
              ptr_00[uVar31 + 7] = iVar43;
              ptr_01[uVar31 + 7] = iVar43;
            }
            ptr_00[6] = 0;
            uVar23 = uVar23 - 1;
            Var16 = CONCAT28(local_2a8,CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46)));
            auVar15._10_2_ = sStack_2a6;
            auVar15._0_10_ = Var16;
            auVar15._12_2_ = local_2a8;
            auVar15._14_2_ = sStack_2a6;
            if ((int)uVar33 < 1) {
              uVar33 = 0;
            }
            local_110 = (ulong)uVar33;
            local_d8 = auVar15 >> 0x10;
            auVar19 = local_d8;
            local_198 = uVar44 * 4;
            local_1a0 = uVar44 * 0x20;
            local_248._8_8_ = 0x100020003;
            local_248._0_8_ = 0x4000500060007;
            local_2b0 = 0;
            local_218 = CONCAT26(sStack_106,CONCAT24(local_108,auVar54._0_4_));
            uStack_210 = CONCAT26(sStack_106,CONCAT24(local_108,auVar54._0_4_));
            auVar54._4_4_ = local_b8;
            auVar54._0_4_ = local_b8;
            auVar54._8_4_ = local_b8;
            auVar54._12_4_ = local_b8;
            uVar31 = 0;
            local_1d8 = auVar15;
            local_e8 = auVar15;
            auVar78 = auVar15;
            auVar68 = auVar15;
            local_48 = auVar15;
            local_208 = auVar15;
            while ((long)uVar31 < lVar45) {
              uVar35 = (uint)uVar31;
              if (matrix->type == 0) {
                uVar21 = (uint)ptr_02[uVar31 + 1];
                uVar32 = (uint)ptr_02[uVar31 + 2];
                uVar36 = (uint)ptr_02[uVar31 + 3];
                uVar41 = (uint)ptr_02[uVar31 + 4];
                uVar39 = (uint)ptr_02[uVar31 + 5];
                uVar37 = (uint)ptr_02[uVar31 + 6];
                uVar29 = (int)ptr_02[uVar31];
                uVar40 = (int)ptr_02[uVar31 + 7];
              }
              else {
                uVar21 = uVar23;
                if ((long)(uVar31 | 1) < lVar45) {
                  uVar21 = uVar35 | 1;
                }
                uVar32 = uVar35 | 2;
                if (lVar45 <= (long)(uVar31 | 2)) {
                  uVar32 = uVar23;
                }
                uVar36 = uVar35 | 3;
                if (lVar45 <= (long)(uVar31 | 3)) {
                  uVar36 = uVar23;
                }
                uVar41 = uVar35 | 4;
                if (lVar45 <= (long)(uVar31 | 4)) {
                  uVar41 = uVar23;
                }
                uVar39 = uVar35 | 5;
                if (lVar45 <= (long)(uVar31 | 5)) {
                  uVar39 = uVar23;
                }
                uVar37 = uVar35 | 6;
                if (lVar45 <= (long)(uVar31 | 6)) {
                  uVar37 = uVar23;
                }
                uVar29 = uVar35;
                uVar40 = uVar35 | 7;
                if (lVar45 <= (long)(uVar31 | 7)) {
                  uVar40 = uVar23;
                }
              }
              local_260 = uVar31 | 1;
              local_268 = uVar31 | 6;
              local_270 = uVar31 | 2;
              local_278 = uVar31 | 3;
              local_280 = uVar31 | 4;
              local_288 = uVar31 | 5;
              local_290 = uVar31 | 7;
              piVar1 = matrix->matrix;
              iVar30 = matrix->size;
              local_118 = piVar1 + (int)(uVar39 * iVar30);
              local_120 = piVar1 + (int)(uVar36 * iVar30);
              local_128 = piVar1 + (int)(uVar21 * iVar30);
              local_130 = piVar1 + (int)(uVar29 * iVar30);
              local_138 = piVar1 + (int)(uVar32 * iVar30);
              local_140 = piVar1 + (int)(uVar41 * iVar30);
              local_148 = piVar1 + (int)(uVar37 * iVar30);
              local_d8._0_8_ = (undefined8)((unkuint10)Var16 >> 0x10);
              local_d8._8_8_ = auVar15._8_8_ >> 0x10;
              auVar55._8_8_ = local_d8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
              auVar55._0_8_ = local_d8._0_8_;
              uVar38 = (ulong)(iVar34 - uVar35 * gap);
              if (s1_beg != 0) {
                uVar38 = 0;
              }
              local_150 = piVar1 + (int)(uVar40 * iVar30);
              auVar88._8_8_ = local_d8._8_8_ | uVar38 << 0x30;
              auVar88._0_8_ = local_d8._0_8_;
              local_190 = uVar31 + 8;
              ptr_00[6] = (short)iVar34 - (short)(uVar31 + 8) * (short)gap;
              local_158 = local_198 * local_290;
              local_168 = local_198 * local_270 + -8;
              local_170 = local_198 * local_278 + -0xc;
              local_178 = local_198 * local_280 + -0x10;
              local_180 = local_198 * local_288 + -0x14;
              local_188 = local_198 * local_268 + -0x18;
              local_160 = local_198 * local_260 + -4;
              local_68 = -(ushort)(local_c8._0_2_ == local_248._0_2_);
              sStack_66 = -(ushort)(local_c8._2_2_ == local_248._2_2_);
              sStack_64 = -(ushort)(local_c8._4_2_ == local_248._4_2_);
              sStack_62 = -(ushort)(local_c8._6_2_ == local_248._6_2_);
              sStack_60 = -(ushort)(local_c8._8_2_ == local_248._8_2_);
              sStack_5e = -(ushort)(local_c8._10_2_ == local_248._10_2_);
              sStack_5c = -(ushort)(local_c8._12_2_ == local_248._12_2_);
              sStack_5a = -(ushort)(local_c8._14_2_ == local_248._14_2_);
              auVar59._4_2_ = local_2a8;
              auVar59._0_4_ = uVar46;
              auVar59._6_2_ = sStack_2a6;
              auVar59._8_2_ = local_2a8;
              auVar59._10_2_ = sStack_2a6;
              auVar59._12_2_ = local_2a8;
              auVar59._14_2_ = sStack_2a6;
              auVar87 = auVar59;
              auVar86 = _DAT_008a1b90;
              for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                local_58._0_8_ = auVar88._2_8_;
                local_58._8_8_ = auVar88._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar31 + 7] << 0x30;
                auVar63._0_8_ = auVar87._2_8_;
                auVar63._8_8_ = auVar87._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar31 + 7] << 0x30;
                auVar87._4_4_ = local_a8;
                auVar87._0_4_ = local_a8;
                auVar87._8_4_ = local_a8;
                auVar87._12_4_ = local_a8;
                auVar60 = psubsw(local_58,auVar87);
                auVar64 = psubsw(auVar63,auVar54);
                sVar3 = auVar60._0_2_;
                sVar51 = auVar64._0_2_;
                auVar65._0_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._2_2_;
                sVar51 = auVar64._2_2_;
                auVar65._2_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._4_2_;
                sVar51 = auVar64._4_2_;
                auVar65._4_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._6_2_;
                sVar51 = auVar64._6_2_;
                auVar65._6_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._8_2_;
                sVar51 = auVar64._8_2_;
                auVar65._8_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._10_2_;
                sVar51 = auVar64._10_2_;
                auVar65._10_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._12_2_;
                sVar51 = auVar64._12_2_;
                sVar53 = auVar64._14_2_;
                auVar65._12_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar60._14_2_;
                auVar65._14_2_ =
                     (ushort)(sVar53 < sVar3) * sVar3 | (ushort)(sVar53 >= sVar3) * sVar53;
                auVar87 = psubsw(auVar88,auVar87);
                auVar59 = psubsw(auVar59,auVar54);
                sVar3 = auVar87._0_2_;
                sVar51 = auVar59._0_2_;
                auVar60._0_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._2_2_;
                sVar51 = auVar59._2_2_;
                auVar60._2_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._4_2_;
                sVar51 = auVar59._4_2_;
                auVar60._4_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._6_2_;
                sVar51 = auVar59._6_2_;
                auVar60._6_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._8_2_;
                sVar51 = auVar59._8_2_;
                auVar60._8_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._10_2_;
                sVar51 = auVar59._10_2_;
                auVar60._10_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._12_2_;
                sVar51 = auVar59._12_2_;
                sVar53 = auVar59._14_2_;
                auVar60._12_2_ =
                     (ushort)(sVar51 < sVar3) * sVar3 | (ushort)(sVar51 >= sVar3) * sVar51;
                sVar3 = auVar87._14_2_;
                auVar60._14_2_ =
                     (ushort)(sVar53 < sVar3) * sVar3 | (ushort)(sVar53 >= sVar3) * sVar53;
                auVar64._14_2_ = (short)(piVar1 + (int)(uVar29 * iVar30))[ptr[uVar31 + 7]];
                auVar64._12_2_ = (short)(piVar1 + (int)(uVar21 * iVar30))[ptr[uVar31 + 6]];
                auVar64._10_2_ = (short)(piVar1 + (int)(uVar32 * iVar30))[ptr[uVar31 + 5]];
                auVar64._8_2_ = (short)(piVar1 + (int)(uVar36 * iVar30))[ptr[uVar31 + 4]];
                auVar64._6_2_ = (short)(piVar1 + (int)(uVar41 * iVar30))[ptr[uVar31 + 3]];
                auVar64._4_2_ = (short)(piVar1 + (int)(uVar39 * iVar30))[ptr[uVar31 + 2]];
                auVar64._0_2_ = (undefined2)(piVar1 + (int)(uVar40 * iVar30))[ptr[uVar31]];
                auVar64._2_2_ = (short)(piVar1 + (int)(uVar37 * iVar30))[ptr[uVar31 + 1]];
                auVar55 = paddsw(auVar55,auVar64);
                uVar66 = ((short)auVar60._0_2_ < (short)auVar65._0_2_) * auVar65._0_2_ |
                         ((short)auVar60._0_2_ >= (short)auVar65._0_2_) * auVar60._0_2_;
                uVar69 = ((short)auVar60._2_2_ < (short)auVar65._2_2_) * auVar65._2_2_ |
                         ((short)auVar60._2_2_ >= (short)auVar65._2_2_) * auVar60._2_2_;
                uVar70 = ((short)auVar60._4_2_ < (short)auVar65._4_2_) * auVar65._4_2_ |
                         ((short)auVar60._4_2_ >= (short)auVar65._4_2_) * auVar60._4_2_;
                uVar71 = ((short)auVar60._6_2_ < (short)auVar65._6_2_) * auVar65._6_2_ |
                         ((short)auVar60._6_2_ >= (short)auVar65._6_2_) * auVar60._6_2_;
                uVar72 = ((short)auVar60._8_2_ < (short)auVar65._8_2_) * auVar65._8_2_ |
                         ((short)auVar60._8_2_ >= (short)auVar65._8_2_) * auVar60._8_2_;
                uVar73 = ((short)auVar60._10_2_ < (short)auVar65._10_2_) * auVar65._10_2_ |
                         ((short)auVar60._10_2_ >= (short)auVar65._10_2_) * auVar60._10_2_;
                uVar74 = ((short)auVar60._12_2_ < (short)auVar65._12_2_) * auVar65._12_2_ |
                         ((short)auVar60._12_2_ >= (short)auVar65._12_2_) * auVar60._12_2_;
                uVar75 = ((short)auVar60._14_2_ < (short)auVar65._14_2_) * auVar65._14_2_ |
                         ((short)auVar60._14_2_ >= (short)auVar65._14_2_) * auVar60._14_2_;
                sVar3 = auVar55._0_2_;
                auVar67._0_2_ =
                     (ushort)((short)uVar66 < sVar3) * sVar3 | ((short)uVar66 >= sVar3) * uVar66;
                sVar3 = auVar55._2_2_;
                auVar67._2_2_ =
                     (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
                sVar3 = auVar55._4_2_;
                auVar67._4_2_ =
                     (ushort)((short)uVar70 < sVar3) * sVar3 | ((short)uVar70 >= sVar3) * uVar70;
                sVar3 = auVar55._6_2_;
                auVar67._6_2_ =
                     (ushort)((short)uVar71 < sVar3) * sVar3 | ((short)uVar71 >= sVar3) * uVar71;
                sVar3 = auVar55._8_2_;
                auVar67._8_2_ =
                     (ushort)((short)uVar72 < sVar3) * sVar3 | ((short)uVar72 >= sVar3) * uVar72;
                sVar3 = auVar55._10_2_;
                auVar67._10_2_ =
                     (ushort)((short)uVar73 < sVar3) * sVar3 | ((short)uVar73 >= sVar3) * uVar73;
                sVar3 = auVar55._12_2_;
                auVar67._12_2_ =
                     (ushort)((short)uVar74 < sVar3) * sVar3 | ((short)uVar74 >= sVar3) * uVar74;
                sVar3 = auVar55._14_2_;
                auVar67._14_2_ =
                     (ushort)((short)uVar75 < sVar3) * sVar3 | ((short)uVar75 >= sVar3) * uVar75;
                sVar76 = auVar86._0_2_;
                auVar77._0_2_ = -(ushort)(sVar76 == -1);
                sVar79 = auVar86._2_2_;
                auVar77._2_2_ = -(ushort)(sVar79 == -1);
                sVar80 = auVar86._4_2_;
                auVar77._4_2_ = -(ushort)(sVar80 == -1);
                sVar81 = auVar86._6_2_;
                auVar77._6_2_ = -(ushort)(sVar81 == -1);
                sVar82 = auVar86._8_2_;
                auVar77._8_2_ = -(ushort)(sVar82 == -1);
                sVar83 = auVar86._10_2_;
                auVar77._10_2_ = -(ushort)(sVar83 == -1);
                sVar84 = auVar86._12_2_;
                sVar85 = auVar86._14_2_;
                auVar77._12_2_ = -(ushort)(sVar84 == -1);
                auVar77._14_2_ = -(ushort)(sVar85 == -1);
                auVar88 = local_258 & auVar77 | ~auVar77 & auVar67;
                sVar3 = auVar88._0_2_;
                sVar51 = auVar88._2_2_;
                sVar14 = auVar88._14_2_;
                sVar8 = auVar88._8_2_;
                sVar10 = auVar88._10_2_;
                sVar12 = auVar88._12_2_;
                sVar53 = auVar88._4_2_;
                sVar7 = auVar88._6_2_;
                if (7 < uVar31) {
                  bVar4 = sVar3 < (short)local_218;
                  uVar73 = (ushort)!bVar4 * (short)local_218;
                  bVar5 = sVar51 < local_218._2_2_;
                  uVar66 = (ushort)!bVar5 * local_218._2_2_;
                  bVar6 = sVar53 < local_218._4_2_;
                  uVar72 = (ushort)!bVar6 * local_218._4_2_;
                  bVar9 = sVar8 < (short)uStack_210;
                  uVar71 = (ushort)!bVar9 * (short)uStack_210;
                  bVar11 = sVar10 < uStack_210._2_2_;
                  uVar70 = (ushort)!bVar11 * uStack_210._2_2_;
                  bVar13 = sVar12 < uStack_210._4_2_;
                  uVar69 = (ushort)!bVar13 * uStack_210._4_2_;
                  local_218 = CONCAT26((ushort)(sVar7 < local_218._6_2_) * sVar7 |
                                       (ushort)(sVar7 >= local_218._6_2_) * local_218._6_2_,
                                       CONCAT24((ushort)bVar6 * sVar53 | uVar72,
                                                CONCAT22((ushort)bVar5 * sVar51 | uVar66,
                                                         (ushort)bVar4 * sVar3 | uVar73)));
                  uStack_210 = CONCAT26((ushort)(sVar14 < uStack_210._6_2_) * sVar14 |
                                        (ushort)(sVar14 >= uStack_210._6_2_) * uStack_210._6_2_,
                                        CONCAT24((ushort)bVar13 * sVar12 | uVar69,
                                                 CONCAT22((ushort)bVar11 * sVar10 | uVar70,
                                                          (ushort)bVar9 * sVar8 | uVar71)));
                  local_208._2_2_ =
                       (ushort)((short)local_208._2_2_ < sVar51) * sVar51 |
                       (ushort)((short)local_208._2_2_ >= sVar51) * local_208._2_2_;
                  local_208._0_2_ =
                       (ushort)((short)local_208._0_2_ < sVar3) * sVar3 |
                       (ushort)((short)local_208._0_2_ >= sVar3) * local_208._0_2_;
                  local_208._4_2_ =
                       (ushort)((short)local_208._4_2_ < sVar53) * sVar53 |
                       (ushort)((short)local_208._4_2_ >= sVar53) * local_208._4_2_;
                  local_208._6_2_ =
                       (ushort)((short)local_208._6_2_ < sVar7) * sVar7 |
                       (ushort)((short)local_208._6_2_ >= sVar7) * local_208._6_2_;
                  local_208._8_2_ =
                       (ushort)((short)local_208._8_2_ < sVar8) * sVar8 |
                       (ushort)((short)local_208._8_2_ >= sVar8) * local_208._8_2_;
                  local_208._10_2_ =
                       (ushort)((short)local_208._10_2_ < sVar10) * sVar10 |
                       (ushort)((short)local_208._10_2_ >= sVar10) * local_208._10_2_;
                  local_208._12_2_ =
                       (ushort)((short)local_208._12_2_ < sVar12) * sVar12 |
                       (ushort)((short)local_208._12_2_ >= sVar12) * local_208._12_2_;
                  local_208._14_2_ =
                       (ushort)((short)local_208._14_2_ < sVar14) * sVar14 |
                       (ushort)((short)local_208._14_2_ >= sVar14) * local_208._14_2_;
                }
                piVar2 = ((ppVar22->field_4).rowcols)->score_row;
                if (uVar31 < uVar44) {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_2b0) = (int)sVar14;
                }
                if (uVar31 - 1 < uVar44 && (long)local_260 < lVar45) {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_160) = (int)sVar12;
                }
                if (((long)local_270 < lVar45) && ((long)(uVar31 - 2) < (long)uVar44 && 1 < uVar31))
                {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_168) = (int)sVar10;
                }
                if (((long)local_278 < lVar45) && ((long)(uVar31 - 3) < (long)uVar44 && 2 < uVar31))
                {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_170) = (int)sVar8;
                }
                if (((long)local_280 < lVar45) && ((long)(uVar31 - 4) < (long)uVar44 && 3 < uVar31))
                {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_178) = (int)sVar7;
                }
                if (((long)local_288 < lVar45) && ((long)(uVar31 - 5) < (long)uVar44 && 4 < uVar31))
                {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_180) = (int)sVar53;
                }
                if (((long)local_268 < lVar45) && ((long)(uVar31 - 6) < (long)uVar44 && 5 < uVar31))
                {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_188) = (int)sVar51;
                }
                auVar17._4_2_ = local_2a8;
                auVar17._0_4_ = uVar46;
                auVar17._6_2_ = sStack_2a6;
                auVar17._8_2_ = local_2a8;
                auVar17._10_2_ = sStack_2a6;
                auVar17._12_2_ = local_2a8;
                auVar17._14_2_ = sStack_2a6;
                auVar87 = ~auVar77 & auVar65 | auVar17 & auVar77;
                if (6 < uVar31 && (long)local_290 < lVar45) {
                  *(int *)((long)piVar2 + uVar31 * 4 + local_198 * local_290 + -0x1c) = (int)sVar3;
                }
                auVar59 = auVar17 & auVar77 | ~auVar77 & auVar60;
                local_78._0_2_ = auVar49._0_2_;
                local_78._2_2_ = auVar49._2_2_;
                auVar56._0_2_ = -(ushort)((short)local_248._0_2_ < (short)local_78._0_2_);
                auVar56._2_2_ = -(ushort)((short)local_248._2_2_ < (short)local_78._2_2_);
                auVar56._4_2_ = -(ushort)((short)local_248._4_2_ < (short)local_78._0_2_);
                auVar56._6_2_ = -(ushort)((short)local_248._6_2_ < (short)local_78._2_2_);
                auVar56._8_2_ = -(ushort)((short)local_248._8_2_ < (short)local_78._0_2_);
                auVar56._10_2_ = -(ushort)((short)local_248._10_2_ < (short)local_78._2_2_);
                auVar56._12_2_ = -(ushort)((short)local_248._12_2_ < (short)local_78._0_2_);
                auVar56._14_2_ = -(ushort)((short)local_248._14_2_ < (short)local_78._2_2_);
                auVar62._0_2_ = -(ushort)(local_88._0_2_ == sVar76);
                auVar62._2_2_ = -(ushort)(local_88._2_2_ == sVar79);
                auVar62._4_2_ = -(ushort)(local_88._4_2_ == sVar80);
                auVar62._6_2_ = -(ushort)(local_88._6_2_ == sVar81);
                auVar62._8_2_ = -(ushort)(local_88._8_2_ == sVar82);
                auVar62._10_2_ = -(ushort)(local_88._10_2_ == sVar83);
                auVar62._12_2_ = -(ushort)(local_88._12_2_ == sVar84);
                auVar62._14_2_ = -(ushort)(local_88._14_2_ == sVar85);
                local_98._0_2_ = auVar52._0_2_;
                local_98._2_2_ = auVar52._2_2_;
                auVar50._0_2_ = -(ushort)(sVar76 < (short)local_98._0_2_);
                auVar50._2_2_ = -(ushort)(sVar79 < (short)local_98._2_2_);
                auVar50._4_2_ = -(ushort)(sVar80 < (short)local_98._0_2_);
                auVar50._6_2_ = -(ushort)(sVar81 < (short)local_98._2_2_);
                auVar50._8_2_ = -(ushort)(sVar82 < (short)local_98._0_2_);
                auVar50._10_2_ = -(ushort)(sVar83 < (short)local_98._2_2_);
                auVar50._12_2_ = -(ushort)(sVar84 < (short)local_98._0_2_);
                auVar50._14_2_ = -(ushort)(sVar85 < (short)local_98._2_2_);
                auVar55 = psraw(auVar86,0xf);
                auVar89._0_2_ = -(ushort)(auVar68._0_2_ < sVar3);
                auVar89._2_2_ = -(ushort)(auVar68._2_2_ < sVar51);
                auVar89._4_2_ = -(ushort)(auVar68._4_2_ < sVar53);
                auVar89._6_2_ = -(ushort)(auVar68._6_2_ < sVar7);
                auVar89._8_2_ = -(ushort)(auVar68._8_2_ < sVar8);
                auVar89._10_2_ = -(ushort)(auVar68._10_2_ < sVar10);
                auVar89._12_2_ = -(ushort)(auVar68._12_2_ < sVar12);
                auVar89._14_2_ = -(ushort)(auVar68._14_2_ < sVar14);
                auVar18._2_2_ = -(ushort)(local_c8._2_2_ == local_248._2_2_);
                auVar18._0_2_ = -(ushort)(local_c8._0_2_ == local_248._0_2_);
                auVar18._4_2_ = -(ushort)(local_c8._4_2_ == local_248._4_2_);
                auVar18._6_2_ = -(ushort)(local_c8._6_2_ == local_248._6_2_);
                auVar18._8_2_ = -(ushort)(local_c8._8_2_ == local_248._8_2_);
                auVar18._10_2_ = -(ushort)(local_c8._10_2_ == local_248._10_2_);
                auVar18._12_2_ = -(ushort)(local_c8._12_2_ == local_248._12_2_);
                auVar18._14_2_ = -(ushort)(local_c8._14_2_ == local_248._14_2_);
                auVar89 = ~auVar55 & auVar50 & auVar18 & auVar89;
                auVar57._0_2_ = -(ushort)(auVar78._0_2_ < sVar3);
                auVar57._2_2_ = -(ushort)(auVar78._2_2_ < sVar51);
                auVar57._4_2_ = -(ushort)(auVar78._4_2_ < sVar53);
                auVar57._6_2_ = -(ushort)(auVar78._6_2_ < sVar7);
                auVar57._8_2_ = -(ushort)(auVar78._8_2_ < sVar8);
                auVar57._10_2_ = -(ushort)(auVar78._10_2_ < sVar10);
                auVar57._12_2_ = -(ushort)(auVar78._12_2_ < sVar12);
                auVar57._14_2_ = -(ushort)(auVar78._14_2_ < sVar14);
                auVar57 = auVar56 & auVar62 & auVar57;
                auVar68 = auVar67 & auVar89 | ~auVar89 & auVar68;
                auVar78 = auVar88 & auVar57 | ~auVar57 & auVar78;
                local_e8 = ~(auVar62 & auVar18) & local_e8 | auVar88 & auVar62 & auVar18;
                ptr_00[uVar31] = sVar3;
                ptr_01[uVar31] = auVar87._0_2_;
                local_1d8 = ~auVar57 & local_1d8 | local_248 & auVar57;
                local_48 = ~auVar89 & local_48 | auVar86 & auVar89;
                auVar86 = paddsw(auVar86,_DAT_008a1ba0);
                auVar55 = local_58;
                local_1b8 = auVar68;
                local_1c8 = auVar78;
              }
              local_248 = paddsw(local_248,_DAT_008a1bb0);
              auVar86._4_4_ = uStack_f4;
              auVar86._0_4_ = local_f8;
              auVar86._8_4_ = uStack_f0;
              auVar86._12_4_ = uStack_ec;
              local_258 = psubsw(local_258,auVar86);
              local_2b0 = local_2b0 + uVar44 * 0x20;
              uVar31 = local_190;
            }
            lVar45 = 0;
            iVar30 = 0;
            uVar33 = 0;
            uVar35 = uVar28;
            uVar21 = uVar28;
            while( true ) {
              uVar66 = (ushort)uVar35;
              uVar69 = (ushort)uVar28;
              if ((int)lVar45 == 8) break;
              uVar70 = *(ushort *)(local_1c8 + lVar45 * 2);
              if ((short)uVar66 < (short)uVar70) {
                uVar33 = (int)*(short *)(local_1d8 + lVar45 * 2);
                uVar35 = (uint)uVar70;
              }
              else if (uVar70 == uVar66) {
                uVar40 = (uint)*(short *)(local_1d8 + lVar45 * 2);
                uVar29 = uVar33;
                if ((int)uVar40 <= (int)uVar33) {
                  uVar29 = uVar40;
                }
                bVar4 = (int)uVar40 < (int)uVar33;
                uVar33 = uVar29;
                if (bVar4) {
                  uVar35 = (uint)uVar70;
                }
              }
              if ((short)uVar69 < (short)*(ushort *)(local_1b8 + lVar45 * 2)) {
                iVar30 = (int)*(short *)(local_48 + lVar45 * 2);
                uVar28 = (uint)*(ushort *)(local_1b8 + lVar45 * 2);
              }
              uVar29 = (uint)*(ushort *)(local_e8 + lVar45 * 2);
              if ((short)*(ushort *)(local_e8 + lVar45 * 2) <= (short)(ushort)uVar21) {
                uVar29 = uVar21;
              }
              uVar21 = uVar29;
              lVar45 = lVar45 + 1;
            }
            if (s1_end == 0 || s2_end == 0) {
              iVar42 = s2Len + -1;
              if ((s1_end == 0) && (uVar66 = (ushort)uVar21, uVar33 = uVar23, s2_end != 0)) {
                iVar42 = iVar30;
                uVar66 = uVar69;
              }
            }
            else if ((short)uVar69 < (short)uVar66) {
              iVar42 = s2Len + -1;
            }
            else if ((uVar66 != uVar69) || (iVar42 = s2Len + -1, iVar30 != s2Len + -1)) {
              iVar42 = iVar30;
              uVar66 = uVar69;
              uVar33 = uVar23;
            }
            auVar49._0_2_ = -(ushort)((short)local_218 < local_2a8);
            auVar49._2_2_ = -(ushort)(local_218._2_2_ < sStack_2a6);
            auVar49._4_2_ = -(ushort)(local_218._4_2_ < local_2a8);
            auVar49._6_2_ = -(ushort)(local_218._6_2_ < sStack_2a6);
            auVar49._8_2_ = -(ushort)((short)uStack_210 < local_2a8);
            auVar49._10_2_ = -(ushort)(uStack_210._2_2_ < sStack_2a6);
            auVar49._12_2_ = -(ushort)(uStack_210._4_2_ < local_2a8);
            auVar49._14_2_ = -(ushort)(uStack_210._6_2_ < sStack_2a6);
            auVar52._0_2_ = -(ushort)(local_108 < (short)local_208._0_2_);
            auVar52._2_2_ = -(ushort)(sStack_106 < (short)local_208._2_2_);
            auVar52._4_2_ = -(ushort)(local_108 < (short)local_208._4_2_);
            auVar52._6_2_ = -(ushort)(sStack_106 < (short)local_208._6_2_);
            auVar52._8_2_ = -(ushort)(local_108 < (short)local_208._8_2_);
            auVar52._10_2_ = -(ushort)(sStack_106 < (short)local_208._10_2_);
            auVar52._12_2_ = -(ushort)(local_108 < (short)local_208._12_2_);
            auVar52._14_2_ = -(ushort)(sStack_106 < (short)local_208._14_2_);
            auVar52 = auVar52 | auVar49;
            if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar52 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar52 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar52[0xf] < '\0') {
              *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
              uVar66 = 0;
              iVar42 = 0;
              uVar33 = 0;
            }
            ppVar22->score = (int)(short)uVar66;
            ppVar22->end_query = uVar33;
            ppVar22->end_ref = iVar42;
            sStack_104 = local_108;
            sStack_102 = sStack_106;
            sStack_100 = local_108;
            sStack_fe = sStack_106;
            sStack_fc = local_108;
            sStack_fa = sStack_106;
            local_d8 = auVar19;
            local_c8 = auVar48;
            local_98 = auVar58;
            local_88 = auVar61;
            local_78 = auVar20;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_02);
              return ppVar22;
            }
            return ppVar22;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar27 = "_s1";
      }
      else {
        uVar31 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_0055a8eb;
        __format = "%s: %s must be > 0\n";
        pcVar27 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_diag_sse2_128_16",pcVar27);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}